

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool ssl_cf_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  long *plVar1;
  undefined8 uVar2;
  ulong uVar3;
  _Bool local_29;
  _Bool result;
  cf_call_data save;
  ssl_connect_data *connssl;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  uVar2 = *(undefined8 *)((long)cf->ctx + 0x48);
  *(Curl_easy **)((long)cf->ctx + 0x48) = data;
  if ((*(long *)(*plVar1 + 0x40) == 0) ||
     (uVar3 = (**(code **)(*plVar1 + 0x40))(cf,data), (uVar3 & 1) == 0)) {
    local_29 = (*cf->next->cft->has_data_pending)(cf->next,data);
  }
  else {
    local_29 = true;
  }
  *(undefined8 *)((long)cf->ctx + 0x48) = uVar2;
  return local_29;
}

Assistant:

static bool ssl_cf_data_pending(struct Curl_cfilter *cf,
                                const struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  bool result;

  CF_DATA_SAVE(save, cf, data);
  if(connssl->ssl_impl->data_pending &&
     connssl->ssl_impl->data_pending(cf, data))
    result = TRUE;
  else
    result = cf->next->cft->has_data_pending(cf->next, data);
  CF_DATA_RESTORE(cf, save);
  return result;
}